

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

bool __thiscall Common::check(Common *this,TaskHandle *head)

{
  element_type *peVar1;
  pointer psVar2;
  bool bVar3;
  byte bVar4;
  shared_ptr<Operand> *operand;
  _Rb_tree_node_base *p_Var5;
  pointer pOVar6;
  size_type sVar7;
  pointer pOVar8;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  ulong uVar9;
  char *fmt;
  pointer __x;
  TaskHandle task;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  pOVar8 = (pointer)(this->operands).
                    super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar6 = (pointer)(this->operands).
                         super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pOVar6 != pOVar8;
      pOVar6 = (pointer)&pOVar6->version) {
    peVar1 = (pOVar6->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->on_device = false;
    peVar1->occurred = false;
  }
  for (p_Var5 = (this->already_on)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->already_on)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    pOVar8 = *(pointer *)(p_Var5 + 1);
    ((json_value *)&pOVar8->gen)[1].boolean = true;
  }
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  do {
    if (local_28._M_ptr == (Task *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
      __x = (this->operands).
            super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (this->operands).
               super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (__x == psVar2) {
          return true;
        }
        bVar4 = ((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->on_device;
        if ((bool)bVar4 == true) {
          sVar7 = std::
                  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                  ::count(&this->not_dealloc,__x);
          pOVar8 = (pointer)(__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (sVar7 == 0) goto LAB_00127f7b;
          bVar4 = ((json_value *)&pOVar8->gen)[1].boolean;
        }
        if ((bVar4 & 1) == 0) {
          sVar7 = std::
                  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                  ::count(&this->not_dealloc,__x);
          if (sVar7 != 0) {
            uVar9 = (ulong)(uint)((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr)->id;
            fmt = "Operand %d has been dealloc but should not\n";
LAB_00127f74:
            do {
              error(fmt,uVar9);
LAB_00127f7b:
              uVar9 = (ulong)*(uint *)&(pOVar8->operand).
                                       super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi;
              fmt = "Forget to dealloc %d\n";
            } while( true );
          }
        }
        __x = __x + 1;
      } while( true );
    }
    bVar3 = Task::isDealloc(local_28._M_ptr);
    if (bVar3) {
      pOVar8 = ((local_28._M_ptr)->outs).
               super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pOVar6 = ((local_28._M_ptr)->outs).
                    super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                    super__Vector_impl_data._M_start; pOVar6 != pOVar8; pOVar6 = pOVar6 + 1) {
        peVar1 = (pOVar6->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1->on_device == false) {
          uVar9 = (ulong)(uint)peVar1->id;
          fmt = "Operand %d not on device (.dealloc)\n";
          goto LAB_00127f74;
        }
        peVar1->on_device = false;
      }
    }
    else {
      pOVar6 = ((local_28._M_ptr)->ins).
               super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
               super__Vector_impl_data._M_start;
      pOVar8 = ((local_28._M_ptr)->ins).
               super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pOVar6 != pOVar8) {
        peVar1 = (pOVar6->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pOVar6 = pOVar6 + 1;
        if (peVar1->on_device == false) {
          uVar9 = (ulong)(uint)peVar1->id;
          fmt = "Operand %d not on device (normal operators)\n";
          goto LAB_00127f74;
        }
      }
      pOVar8 = ((local_28._M_ptr)->outs).
               super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pOVar6 = ((local_28._M_ptr)->outs).
                    super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                    super__Vector_impl_data._M_start; pOVar6 != pOVar8; pOVar6 = pOVar6 + 1) {
        ((pOVar6->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        on_device = true;
      }
    }
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_28,
               &((local_28._M_ptr)->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  } while( true );
}

Assistant:

bool check(TaskHandle &head) const {
        // Clear status
        for (auto &operand: operands) {
            operand->clear();
        }
        for (auto &operand: already_on) {
            operand->on_device = true;
        }

        // Simulate and check
        LOOP(task, head) {
            if (task->isDealloc()) {
                for (auto &usage: task->outs) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (.dealloc)\n", usage.operand->id);
                        return false;
                    }
                    usage.operand->on_device = false;
                }
            } else {
                for (auto &usage: task->ins) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (normal operators)\n", usage.operand->id);
                        return false;
                    }
                }
                for (auto &usage: task->outs) {
                    usage.operand->on_device = true;
                }
            }
        }

        // Check final status
        for (auto &operand: operands) {
            if (operand->on_device and not not_dealloc.count(operand)) {
                error("Forget to dealloc %d\n", operand->id);
                return false;
            }
            if (not operand->on_device and not_dealloc.count(operand)) {
                error("Operand %d has been dealloc but should not\n", operand->id);
                return false;
            }
        }
        return true;
    }